

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall Diligent::RefCountersImpl::~RefCountersImpl(RefCountersImpl *this)

{
  Char *Message;
  undefined1 local_60 [8];
  string msg;
  RefCountersImpl *this_local;
  memory_order __b_1;
  memory_order __b;
  
  msg.field_2._8_8_ = this;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (((this->m_NumStrongReferences).super___atomic_base<int>._M_i != 0) ||
     (std::operator&(memory_order_seq_cst,__memory_order_mask),
     (this->m_NumWeakReferences).super___atomic_base<int>._M_i != 0)) {
    FormatString<char[65]>
              ((string *)local_60,
               (char (*) [65])"There exist outstanding references to the object being destroyed");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~RefCountersImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x1cb);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

~RefCountersImpl()
    {
        VERIFY(m_NumStrongReferences.load() == 0 && m_NumWeakReferences.load() == 0,
               "There exist outstanding references to the object being destroyed");
    }